

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O0

boolean readlibdir(library *lp)

{
  int iVar1;
  libdir *plVar2;
  char *pcVar3;
  long local_38;
  long totalsize;
  long liboffset;
  char *sp;
  library *plStack_18;
  int i;
  library *lp_local;
  
  plStack_18 = lp;
  iVar1 = __isoc99_fscanf(lp->fdata,"%ld %ld %ld %ld %ld\n",&lp->rev,&lp->nentries,&lp->strsize,
                          &totalsize,&local_38);
  if (iVar1 == 5) {
    if ((plStack_18->rev < 2) && (0 < plStack_18->rev)) {
      plVar2 = (libdir *)malloc(plStack_18->nentries << 5);
      plStack_18->dir = plVar2;
      pcVar3 = (char *)malloc(plStack_18->strsize);
      plStack_18->sspace = pcVar3;
      sp._4_4_ = 0;
      liboffset = (long)plStack_18->sspace;
      for (; (long)sp._4_4_ < plStack_18->nentries; sp._4_4_ = sp._4_4_ + 1) {
        plStack_18->dir[sp._4_4_].fname = (char *)liboffset;
        iVar1 = __isoc99_fscanf(plStack_18->fdata,"%c%s %ld\n",&plStack_18->dir[sp._4_4_].handling,
                                liboffset,&plStack_18->dir[sp._4_4_].foffset);
        if (iVar1 != 3) {
          free(plStack_18->dir);
          free(plStack_18->sspace);
          plStack_18->dir = (libdir *)0x0;
          plStack_18->sspace = (char *)0x0;
          return '\0';
        }
        pcVar3 = eos((char *)liboffset);
        liboffset = (long)(pcVar3 + 1);
      }
      for (sp._4_4_ = 0; (long)sp._4_4_ < plStack_18->nentries; sp._4_4_ = sp._4_4_ + 1) {
        if ((long)sp._4_4_ == plStack_18->nentries + -1) {
          plStack_18->dir[sp._4_4_].fsize = local_38 - plStack_18->dir[sp._4_4_].foffset;
        }
        else {
          plStack_18->dir[sp._4_4_].fsize =
               plStack_18->dir[sp._4_4_ + 1].foffset - plStack_18->dir[sp._4_4_].foffset;
        }
      }
      fseek((FILE *)plStack_18->fdata,0,0);
      plStack_18->fmark = 0;
      lp_local._7_1_ = '\x01';
    }
    else {
      lp_local._7_1_ = '\0';
    }
  }
  else {
    lp_local._7_1_ = '\0';
  }
  return lp_local._7_1_;
}

Assistant:

static boolean readlibdir(library *lp)
/* lp: library pointer to fill in */
{
    int i;
    char *sp;
    long liboffset, totalsize;

    if (fscanf(lp->fdata, "%ld %ld %ld %ld %ld\n",
	    &lp->rev,&lp->nentries,&lp->strsize,&liboffset,&totalsize) != 5)
	return FALSE;
    if (lp->rev > DLB_MAX_VERS || lp->rev < DLB_MIN_VERS) return FALSE;

    lp->dir = malloc(lp->nentries * sizeof(libdir));
    lp->sspace = malloc(lp->strsize);

    /* read in each directory entry */
    for (i = 0, sp = lp->sspace; i < lp->nentries; i++) {
	lp->dir[i].fname = sp;
	if (fscanf(lp->fdata, "%c%s %ld\n",
			&lp->dir[i].handling, sp, &lp->dir[i].foffset) != 3) {
	    free(lp->dir);
	    free(lp->sspace);
	    lp->dir = NULL;
	    lp->sspace = NULL;
	    return FALSE;
	}
	sp = eos(sp) + 1;
    }

    /* calculate file sizes using offset information */
    for (i = 0; i < lp->nentries; i++) {
	if (i == lp->nentries - 1)
	    lp->dir[i].fsize = totalsize - lp->dir[i].foffset;
	else
	    lp->dir[i].fsize = lp->dir[i+1].foffset - lp->dir[i].foffset;
    }

    fseek(lp->fdata, 0L, SEEK_SET);	/* reset back to zero */
    lp->fmark = 0;

    return TRUE;
}